

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_exp_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *E,mbedtls_mpi *N,mbedtls_mpi *_RR
                       )

{
  int iVar1;
  sbyte sVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  mbedtls_mpi_uint mm;
  ulong uVar10;
  mbedtls_mpi_uint m0;
  mbedtls_mpi *pmVar11;
  bool bVar12;
  long lStack_ce0;
  mbedtls_mpi *local_cc8;
  ulong local_cc0;
  ulong local_cb0;
  mbedtls_mpi T;
  mbedtls_mpi RR;
  mbedtls_mpi Apos;
  mbedtls_mpi W [128];
  
  iVar3 = mbedtls_mpi_cmp_int(N,0);
  if (iVar3 < 1) {
    return -4;
  }
  uVar10 = *N->p;
  if ((uVar10 & 1) == 0) {
    return -4;
  }
  iVar3 = mbedtls_mpi_cmp_int(E,0);
  if (iVar3 < 0) {
    return -4;
  }
  lVar9 = ((int)uVar10 * 2 + 4U & 8) + uVar10;
  for (uVar4 = 0x40; 7 < uVar4; uVar4 = uVar4 >> 1) {
    lVar9 = lVar9 * (2 - lVar9 * uVar10);
  }
  T.s = 1;
  RR.s = 1;
  RR.n = 0;
  RR.p = (mbedtls_mpi_uint *)0x0;
  T.n = 0;
  T.p = (mbedtls_mpi_uint *)0x0;
  Apos.n = 0;
  Apos.p = (mbedtls_mpi_uint *)0x0;
  Apos.s = T.s;
  memset(W,0,0xc00);
  sVar5 = mbedtls_mpi_bitlen(E);
  if (sVar5 < 0x2a0) {
    if (sVar5 < 0xf0) {
      if (sVar5 < 0x50) {
        lStack_ce0 = (ulong)(0x17 < sVar5) * 2 + 1;
      }
      else {
        lStack_ce0 = 4;
      }
    }
    else {
      lStack_ce0 = 5;
    }
  }
  else {
    lStack_ce0 = 6;
  }
  sVar5 = N->n + 1;
  iVar3 = mbedtls_mpi_grow(X,sVar5);
  sVar2 = (sbyte)lStack_ce0;
  if (((iVar3 == 0) && (iVar3 = mbedtls_mpi_grow(W + 1,sVar5), iVar3 == 0)) &&
     (iVar3 = mbedtls_mpi_grow(&T,sVar5 * 2), iVar3 == 0)) {
    iVar1 = A->s;
    if (iVar1 == -1) {
      iVar3 = mbedtls_mpi_copy(&Apos,A);
      if (iVar3 != 0) goto LAB_0011cebd;
      Apos.s = 1;
      A = &Apos;
    }
    if ((_RR == (mbedtls_mpi *)0x0) || (_RR->p == (mbedtls_mpi_uint *)0x0)) {
      iVar3 = mbedtls_mpi_lset(&RR,1);
      if ((iVar3 != 0) ||
         ((iVar3 = mbedtls_mpi_shift_l(&RR,N->n << 7), iVar3 != 0 ||
          (iVar3 = mbedtls_mpi_mod_mpi(&RR,&RR,N), iVar3 != 0)))) goto LAB_0011cebd;
      if (_RR != (mbedtls_mpi *)0x0) {
        _RR->p = RR.p;
        _RR->s = RR.s;
        *(undefined4 *)&_RR->field_0x4 = RR._4_4_;
        _RR->n = RR.n;
      }
    }
    else {
      RR.p = _RR->p;
      RR.s = _RR->s;
      RR._4_4_ = *(undefined4 *)&_RR->field_0x4;
      RR.n = _RR->n;
    }
    iVar3 = mbedtls_mpi_cmp_mpi(A,N);
    pmVar11 = W + 1;
    if (iVar3 < 0) {
      iVar3 = mbedtls_mpi_copy(pmVar11,A);
    }
    else {
      iVar3 = mbedtls_mpi_mod_mpi(pmVar11,A,N);
    }
    if (iVar3 == 0) {
      mm = -lVar9;
      iVar3 = mpi_montmul(pmVar11,&RR,N,mm,&T);
      if (((iVar3 == 0) && (iVar3 = mbedtls_mpi_copy(X,&RR), iVar3 == 0)) &&
         (iVar3 = mpi_montred(X,N,mm,&T), iVar3 == 0)) {
        if ((uint)lStack_ce0 < 2) {
LAB_0011d207:
          sVar5 = E->n;
          local_cb0 = 0;
          uVar10 = 0;
          local_cc0 = 0;
          lVar9 = 0;
          uVar6 = local_cc0;
LAB_0011d232:
          do {
            do {
              local_cc0 = uVar6;
              lVar7 = lVar9;
              if (uVar10 == 0) {
                if (sVar5 == 0) {
                  goto LAB_0011d370;
                }
                sVar5 = sVar5 - 1;
                uVar10 = 0x40;
              }
              uVar10 = uVar10 - 1;
              uVar8 = (ulong)((E->p[sVar5] >> (uVar10 & 0x3f) & 1) != 0);
              lVar9 = 0;
              uVar6 = local_cc0;
            } while (uVar8 == 0 && lVar7 == 0);
            if ((lVar7 == 1) && (uVar8 == 0)) {
              iVar3 = mpi_montmul(X,X,N,mm,&T);
            }
            else {
              uVar6 = local_cc0 + 1;
              local_cb0 = local_cb0 | uVar8 << (sVar2 - (char)uVar6 & 0x3fU);
              lVar9 = 2;
              local_cc0 = lStack_ce0 + 1;
              if (lStack_ce0 != uVar6) goto LAB_0011d232;
              while (local_cc0 + -1 != 0) {
                iVar3 = mpi_montmul(X,X,N,mm,&T);
                local_cc0 = local_cc0 + -1;
                if (iVar3 != 0) goto LAB_0011cebd;
              }
              iVar3 = mpi_montmul(X,W + local_cb0,N,mm,&T);
              local_cb0 = 0;
              local_cc0 = 0;
            }
            lVar9 = 1;
            uVar6 = local_cc0;
          } while (iVar3 == 0);
        }
        else {
          local_cc0 = 1L << (sVar2 - 1U & 0x3f);
          local_cc8 = W + local_cc0;
          iVar3 = mbedtls_mpi_grow(local_cc8,N->n + 1);
          if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_copy(local_cc8,W + 1), iVar3 == 0)) {
            local_cb0 = lStack_ce0;
            do {
              local_cb0 = local_cb0 + -1;
              if (local_cb0 == 0) goto LAB_0011d18b;
              iVar3 = mpi_montmul(local_cc8,local_cc8,N,mm,&T);
            } while (iVar3 == 0);
          }
        }
      }
    }
  }
  goto LAB_0011cebd;
LAB_0011d370:
  bVar12 = local_cc0 == 0;
  local_cc0 = local_cc0 + -1;
  if (bVar12) {
    iVar3 = mpi_montred(X,N,mm,&T);
    if (((iVar1 == -1) && (iVar3 == 0)) && ((iVar3 = 0, E->n != 0 && ((*E->p & 1) != 0)))) {
      X->s = -1;
      iVar3 = mbedtls_mpi_add_mpi(X,N,X);
    }
    goto LAB_0011cebd;
  }
  iVar3 = mpi_montmul(X,X,N,mm,&T);
  if ((iVar3 != 0) ||
     ((local_cb0 = local_cb0 * 2, ((uint)local_cb0 & (uint)(1L << sVar2)) != 0 &&
      (iVar3 = mpi_montmul(X,W + 1,N,mm,&T), iVar3 != 0)))) goto LAB_0011cebd;
  goto LAB_0011d370;
  while( true ) {
    pmVar11 = local_cc8 + 1;
    iVar3 = mbedtls_mpi_grow(pmVar11,N->n + 1);
    if (((iVar3 != 0) || (iVar3 = mbedtls_mpi_copy(pmVar11,local_cc8), iVar3 != 0)) ||
       (iVar3 = mpi_montmul(pmVar11,W + 1,N,mm,&T), local_cc8 = pmVar11, iVar3 != 0)) break;
LAB_0011d18b:
    local_cc0 = local_cc0 + 1;
    if (local_cc0 >> sVar2 != 0) goto LAB_0011d207;
  }
LAB_0011cebd:
  uVar10 = 1L << (sVar2 - 1U & 0x3f);
  pmVar11 = W + uVar10;
  for (; uVar10 >> sVar2 == 0; uVar10 = uVar10 + 1) {
    mbedtls_mpi_free(pmVar11);
    pmVar11 = pmVar11 + 1;
  }
  mbedtls_mpi_free(W + 1);
  mbedtls_mpi_free(&T);
  mbedtls_mpi_free(&Apos);
  if ((_RR == (mbedtls_mpi *)0x0) || (_RR->p == (mbedtls_mpi_uint *)0x0)) {
    mbedtls_mpi_free(&RR);
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_exp_mod( mbedtls_mpi *X, const mbedtls_mpi *A,
                         const mbedtls_mpi *E, const mbedtls_mpi *N,
                         mbedtls_mpi *_RR )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t wbits, wsize, one = 1;
    size_t i, j, nblimbs;
    size_t bufsize, nbits;
    mbedtls_mpi_uint ei, mm, state;
    mbedtls_mpi RR, T, W[ 2 << MBEDTLS_MPI_WINDOW_SIZE ], Apos;
    int neg;

    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( E != NULL );
    MPI_VALIDATE_RET( N != NULL );

    if( mbedtls_mpi_cmp_int( N, 0 ) <= 0 || ( N->p[0] & 1 ) == 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    if( mbedtls_mpi_cmp_int( E, 0 ) < 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    /*
     * Init temps and window size
     */
    mpi_montg_init( &mm, N );
    mbedtls_mpi_init( &RR ); mbedtls_mpi_init( &T );
    mbedtls_mpi_init( &Apos );
    memset( W, 0, sizeof( W ) );

    i = mbedtls_mpi_bitlen( E );

    wsize = ( i > 671 ) ? 6 : ( i > 239 ) ? 5 :
            ( i >  79 ) ? 4 : ( i >  23 ) ? 3 : 1;

#if( MBEDTLS_MPI_WINDOW_SIZE < 6 )
    if( wsize > MBEDTLS_MPI_WINDOW_SIZE )
        wsize = MBEDTLS_MPI_WINDOW_SIZE;
#endif

    j = N->n + 1;
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &W[1],  j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T, j * 2 ) );

    /*
     * Compensate for negative A (and correct at the end)
     */
    neg = ( A->s == -1 );
    if( neg )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Apos, A ) );
        Apos.s = 1;
        A = &Apos;
    }

    /*
     * If 1st call, pre-compute R^2 mod N
     */
    if( _RR == NULL || _RR->p == NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &RR, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &RR, N->n * 2 * biL ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &RR, &RR, N ) );

        if( _RR != NULL )
            memcpy( _RR, &RR, sizeof( mbedtls_mpi ) );
    }
    else
        memcpy( &RR, _RR, sizeof( mbedtls_mpi ) );

    /*
     * W[1] = A * R^2 * R^-1 mod N = A * R mod N
     */
    if( mbedtls_mpi_cmp_mpi( A, N ) >= 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &W[1], A, N ) );
    else
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &W[1], A ) );

    MBEDTLS_MPI_CHK( mpi_montmul( &W[1], &RR, N, mm, &T ) );

    /*
     * X = R^2 * R^-1 mod N = R mod N
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, &RR ) );
    MBEDTLS_MPI_CHK( mpi_montred( X, N, mm, &T ) );

    if( wsize > 1 )
    {
        /*
         * W[1 << (wsize - 1)] = W[1] ^ (wsize - 1)
         */
        j =  one << ( wsize - 1 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &W[j], N->n + 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &W[j], &W[1]    ) );

        for( i = 0; i < wsize - 1; i++ )
            MBEDTLS_MPI_CHK( mpi_montmul( &W[j], &W[j], N, mm, &T ) );

        /*
         * W[i] = W[i - 1] * W[1]
         */
        for( i = j + 1; i < ( one << wsize ); i++ )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &W[i], N->n + 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &W[i], &W[i - 1] ) );

            MBEDTLS_MPI_CHK( mpi_montmul( &W[i], &W[1], N, mm, &T ) );
        }
    }

    nblimbs = E->n;
    bufsize = 0;
    nbits   = 0;
    wbits   = 0;
    state   = 0;

    while( 1 )
    {
        if( bufsize == 0 )
        {
            if( nblimbs == 0 )
                break;

            nblimbs--;

            bufsize = sizeof( mbedtls_mpi_uint ) << 3;
        }

        bufsize--;

        ei = (E->p[nblimbs] >> bufsize) & 1;

        /*
         * skip leading 0s
         */
        if( ei == 0 && state == 0 )
            continue;

        if( ei == 0 && state == 1 )
        {
            /*
             * out of window, square X
             */
            MBEDTLS_MPI_CHK( mpi_montmul( X, X, N, mm, &T ) );
            continue;
        }

        /*
         * add ei to current window
         */
        state = 2;

        nbits++;
        wbits |= ( ei << ( wsize - nbits ) );

        if( nbits == wsize )
        {
            /*
             * X = X^wsize R^-1 mod N
             */
            for( i = 0; i < wsize; i++ )
                MBEDTLS_MPI_CHK( mpi_montmul( X, X, N, mm, &T ) );

            /*
             * X = X * W[wbits] R^-1 mod N
             */
            MBEDTLS_MPI_CHK( mpi_montmul( X, &W[wbits], N, mm, &T ) );

            state--;
            nbits = 0;
            wbits = 0;
        }
    }

    /*
     * process the remaining bits
     */
    for( i = 0; i < nbits; i++ )
    {
        MBEDTLS_MPI_CHK( mpi_montmul( X, X, N, mm, &T ) );

        wbits <<= 1;

        if( ( wbits & ( one << wsize ) ) != 0 )
            MBEDTLS_MPI_CHK( mpi_montmul( X, &W[1], N, mm, &T ) );
    }

    /*
     * X = A^E * R * R^-1 mod N = A^E mod N
     */
    MBEDTLS_MPI_CHK( mpi_montred( X, N, mm, &T ) );

    if( neg && E->n != 0 && ( E->p[0] & 1 ) != 0 )
    {
        X->s = -1;
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( X, N, X ) );
    }

cleanup:

    for( i = ( one << ( wsize - 1 ) ); i < ( one << wsize ); i++ )
        mbedtls_mpi_free( &W[i] );

    mbedtls_mpi_free( &W[1] ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &Apos );

    if( _RR == NULL || _RR->p == NULL )
        mbedtls_mpi_free( &RR );

    return( ret );
}